

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O1

void __thiscall
pbrt::RGBFilm::AddSample
          (RGBFilm *this,Point2i *pFilm,SampledSpectrum L,SampledWavelengths *lambda,
          VisibleSurface *param_4,Float weight)

{
  Float FVar1;
  PixelSensor *this_00;
  Pixel *pPVar2;
  undefined1 auVar3 [16];
  float *__result;
  float *pfVar4;
  long lVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  float fVar12;
  RGB RVar13;
  SampledSpectrum H;
  undefined8 local_38;
  float local_30;
  SampledSpectrum local_28;
  
  auVar11._8_56_ = L._16_56_;
  auVar11._0_8_ = L.values.values._8_8_;
  auVar8._8_56_ = L._8_56_;
  auVar8._0_8_ = L.values.values._0_8_;
  this_00 = (this->super_FilmBase).sensor;
  auVar7 = vmovlhps_avx(auVar8._0_16_,auVar11._0_16_);
  FVar1 = this_00->imagingRatio;
  auVar3._4_4_ = FVar1;
  auVar3._0_4_ = FVar1;
  auVar3._8_4_ = FVar1;
  auVar3._12_4_ = FVar1;
  local_28.values.values = (array<float,_4>)vmulps_avx512vl(auVar7,auVar3);
  auVar10 = ZEXT856(local_28.values.values._8_8_);
  RVar13 = PixelSensor::ToSensorRGB(this_00,&local_28,lambda);
  local_30 = RVar13.b;
  auVar9._0_8_ = RVar13._0_8_;
  auVar9._8_56_ = auVar10;
  pfVar4 = (float *)&local_38;
  auVar7 = auVar9._0_16_;
  local_38 = vmovlps_avx(auVar7);
  lVar5 = 4;
  do {
    if (*pfVar4 < *(float *)((long)&local_38 + lVar5)) {
      pfVar4 = (float *)((long)&local_38 + lVar5);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  if (this->maxComponentValue < *pfVar4) {
    fVar12 = this->maxComponentValue / *pfVar4;
    auVar7._0_4_ = RVar13.r * fVar12;
    auVar7._4_4_ = RVar13.g * fVar12;
    auVar7._8_4_ = auVar10._0_4_ * fVar12;
    auVar7._12_4_ = auVar10._4_4_ * fVar12;
    local_30 = local_30 * fVar12;
  }
  iVar6 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar6 = ((this->pixels).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar6) *
          ((pFilm->super_Tuple2<pbrt::Point2,_int>).y -
          (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
          ((pFilm->super_Tuple2<pbrt::Point2,_int>).x - iVar6);
  pPVar2 = (this->pixels).values;
  auVar3 = vmovshdup_avx(auVar7);
  lVar5 = 0;
  do {
    fVar12 = auVar7._0_4_;
    if (((int)lVar5 != 0) && (fVar12 = auVar3._0_4_, (int)lVar5 != 1)) {
      fVar12 = local_30;
    }
    pPVar2[iVar6].rgbSum[lVar5] = (double)(fVar12 * weight) + pPVar2[iVar6].rgbSum[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  pPVar2[iVar6].weightSum = (double)weight + pPVar2[iVar6].weightSum;
  return;
}

Assistant:

PBRT_CPU_GPU
    void AddSample(const Point2i &pFilm, SampledSpectrum L,
                   const SampledWavelengths &lambda, const VisibleSurface *,
                   Float weight) {
        // Convert sample radiance to _PixelSensor_ RGB
        SampledSpectrum H = L * sensor->ImagingRatio();
        RGB rgb = sensor->ToSensorRGB(H, lambda);

        // Optionally clamp sensor RGB value
        Float m = std::max({rgb.r, rgb.g, rgb.b});
        if (m > maxComponentValue) {
            H *= maxComponentValue / m;
            rgb *= maxComponentValue / m;
        }

        DCHECK(InsideExclusive(pFilm, pixelBounds));
        // Update pixel values with filtered sample contribution
        Pixel &pixel = pixels[pFilm];
        for (int c = 0; c < 3; ++c)
            pixel.rgbSum[c] += weight * rgb[c];
        pixel.weightSum += weight;
    }